

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

optional<double> __thiscall RPCHelpMan::MaybeArg<double>(RPCHelpMan *this,string_view key)

{
  string_view key_00;
  size_t i_00;
  RPCHelpMan *in_RSI;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  optional<double> oVar1;
  optional<double> oVar2;
  size_t i;
  undefined1 in_stack_fffffffffffffff0;
  undefined7 in_stack_fffffffffffffff1;
  char *pcVar3;
  
  pcVar3 = *(char **)(in_FS_OFFSET + 0x28);
  key_00._M_len._1_7_ = in_stack_fffffffffffffff1;
  key_00._M_len._0_1_ = in_stack_fffffffffffffff0;
  key_00._M_str = pcVar3;
  i_00 = GetParamIndex(in_RSI,key_00);
  oVar1 = ArgValue<std::optional<double>>(in_RDI,i_00);
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = oVar1.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar3) {
    oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _9_7_ = (undefined7)((ulong)*(char **)(in_FS_OFFSET + 0x28) >> 8);
    oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload = oVar1.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
    return (optional<double>)
           oVar2.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>;
  }
  __stack_chk_fail();
}

Assistant:

auto MaybeArg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return optional argument (without default).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value, wrapped in optional.
            return ArgValue<std::optional<R>>(i);
        } else {
            // Return other types by pointer.
            return ArgValue<const R*>(i);
        }
    }